

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::cpp_function::destruct(function_record *rec)

{
  function_record *pfVar1;
  bool bVar2;
  reference paVar3;
  argument_record *arg;
  iterator __end3;
  iterator __begin3;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range3;
  function_record *next;
  function_record *rec_local;
  
  pfVar1 = rec;
  while (next = pfVar1, next != (function_record *)0x0) {
    pfVar1 = next->next;
    if (next->free_data != (_func_void_function_record_ptr *)0x0) {
      (*next->free_data)(next);
    }
    free(next->name);
    free(next->doc);
    free(next->signature);
    __end3 = std::
             vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
             ::begin(&next->args);
    arg = (argument_record *)
          std::
          vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
          ::end(&next->args);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                       *)&arg), bVar2) {
      paVar3 = __gnu_cxx::
               __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
               ::operator*(&__end3);
      free(*(void **)paVar3);
      free(*(void **)(paVar3 + 8));
      handle::dec_ref((handle *)(paVar3 + 0x10));
      __gnu_cxx::
      __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
      ::operator++(&__end3);
    }
    if (next->def != (PyMethodDef *)0x0) {
      free(next->def->ml_doc);
      if (next->def != (PyMethodDef *)0x0) {
        operator_delete(next->def);
      }
    }
    if (next != (function_record *)0x0) {
      detail::function_record::~function_record(next);
      operator_delete(next);
    }
  }
  return;
}

Assistant:

static void destruct(detail::function_record *rec) {
        while (rec) {
            detail::function_record *next = rec->next;
            if (rec->free_data)
                rec->free_data(rec);
            std::free((char *) rec->name);
            std::free((char *) rec->doc);
            std::free((char *) rec->signature);
            for (auto &arg: rec->args) {
                std::free(const_cast<char *>(arg.name));
                std::free(const_cast<char *>(arg.descr));
                arg.value.dec_ref();
            }
            if (rec->def) {
                std::free(const_cast<char *>(rec->def->ml_doc));
                delete rec->def;
            }
            delete rec;
            rec = next;
        }
    }